

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_writer.c
# Opt level: O0

void aom_video_writer_close(AvxVideoWriter *writer)

{
  void *in_RDI;
  int in_stack_00000384;
  AvxVideoInfo *in_stack_00000388;
  FILE *in_stack_00000390;
  
  if (in_RDI != (void *)0x0) {
    rewind(*(FILE **)((long)in_RDI + 0x18));
    write_header(in_stack_00000390,in_stack_00000388,in_stack_00000384);
    fclose(*(FILE **)((long)in_RDI + 0x18));
    free(in_RDI);
  }
  return;
}

Assistant:

void aom_video_writer_close(AvxVideoWriter *writer) {
  if (writer) {
    // Rewriting frame header with real frame count
    rewind(writer->file);
    write_header(writer->file, &writer->info, writer->frame_count);

    fclose(writer->file);
    free(writer);
  }
}